

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

FBaseCVar * GetUserCVar(int playernum,char *cvarname)

{
  FBaseCVar *this;
  uint32 uVar1;
  FBaseCVar *cvar;
  FBaseCVar **local_28;
  FBaseCVar **cvar_p;
  char *cvarname_local;
  FBaseCVar *pFStack_10;
  int playernum_local;
  
  if (((uint)playernum < 8) && ((playeringame[playernum] & 1U) != 0)) {
    cvar_p = (FBaseCVar **)cvarname;
    cvarname_local._4_4_ = playernum;
    FName::FName((FName *)((long)&cvar + 4),cvarname,true);
    local_28 = TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>::CheckKey
                         ((TMap<FName,_FBaseCVar_*,_THashTraits<FName>,_TValueTraits<FBaseCVar_*>_>
                           *)((long)playernum * 0x2a0 + 0xd63498),(FName *)((long)&cvar + 4));
    if (((local_28 == (FBaseCVar **)0x0) || (this = *local_28, this == (FBaseCVar *)0x0)) ||
       (uVar1 = FBaseCVar::GetFlags(this), pFStack_10 = this, (uVar1 & 0x4000) != 0)) {
      pFStack_10 = (FBaseCVar *)0x0;
    }
  }
  else {
    pFStack_10 = (FBaseCVar *)0x0;
  }
  return pFStack_10;
}

Assistant:

FBaseCVar *GetUserCVar(int playernum, const char *cvarname)
{
	if ((unsigned)playernum >= MAXPLAYERS || !playeringame[playernum])
	{
		return nullptr;
	}
	FBaseCVar **cvar_p = players[playernum].userinfo.CheckKey(FName(cvarname, true));
	FBaseCVar *cvar;
	if (cvar_p == nullptr || (cvar = *cvar_p) == nullptr || (cvar->GetFlags() & CVAR_IGNORE))
	{
		return nullptr;
	}
	return cvar;
}